

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indlg_tx.c
# Opt level: O1

int tio_input_dialog(int icon_id,char *prompt,int standard_button_set,char **buttons,
                    int button_count,int default_index,int cancel_index)

{
  char cVar1;
  int iVar2;
  ulong in_RAX;
  ushort **ppuVar3;
  size_t sVar4;
  __int32_t **pp_Var5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  int iVar11;
  byte bVar12;
  byte *__s;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  char buf [256];
  char **local_168;
  ulong local_150;
  byte local_138;
  byte local_137 [263];
  
  uVar8 = (ulong)(uint)button_count;
  local_168 = buttons;
  local_150 = in_RAX;
  do {
    __s = &local_138;
    switch(standard_button_set) {
    case 0:
      goto switchD_0012ba6a_caseD_0;
    case 1:
      iVar11 = 0;
      break;
    case 2:
      iVar11 = 1;
      break;
    case 3:
      iVar11 = 2;
      break;
    case 4:
      iVar11 = 3;
      break;
    default:
      goto switchD_0012ba6a_default;
    }
    local_168 = (char **)((long)tio_input_dialog::std_btns[0].buttons + (ulong)(uint)(iVar11 << 5));
    uVar8 = (ulong)*(uint *)((long)tio_input_dialog::std_btns[0].buttons +
                            (ulong)(uint)(iVar11 << 5) + 0x18);
switchD_0012ba6a_caseD_0:
    iVar11 = (int)uVar8;
    if (iVar11 == 0) {
      uVar8 = 0;
switchD_0012ba6a_default:
      bVar15 = false;
      in_RAX = 0;
    }
    else {
      outformat("\\n");
      outformat(prompt);
      outformat(" ");
      if (0 < iVar11) {
        uVar9 = 0;
        do {
          if (uVar9 != 0) {
            outformat("/");
          }
          pbVar10 = (byte *)local_168[uVar9];
          for (lVar6 = 0; pbVar10[lVar6] != 0; lVar6 = lVar6 + 1) {
            if (pbVar10[lVar6] == 0x26) {
              sprintf((char *)__s,"%.*s(%c)%s",lVar6,pbVar10,
                      (ulong)(uint)(int)(char)pbVar10[lVar6 + 1]);
              pbVar10 = __s;
              break;
            }
          }
          outformat((char *)pbVar10);
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar8);
      }
      iVar2 = tio_is_html_mode();
      if (iVar2 != 0) {
        outformat("<font face=\'TADS-Input\'>");
      }
      getstring(" >",(char *)__s,0x100);
      iVar2 = tio_is_html_mode();
      if (iVar2 != 0) {
        outformat("</font>");
      }
      bVar7 = local_138;
      if (-1 < (char)local_138) {
        ppuVar3 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar3 + (ulong)bVar7 * 2 + 1) & 0x20) == 0) break;
          bVar7 = __s[1];
          __s = __s + 1;
        } while (-1 < (char)bVar7);
      }
      sVar4 = strlen((char *)__s);
      if ((sVar4 == 1) && (0 < iVar11)) {
        uVar9 = 0;
        do {
          pcVar14 = local_168[uVar9];
          do {
            pcVar13 = pcVar14 + 1;
            cVar1 = *pcVar14;
            if (cVar1 == '\0') goto LAB_0012bbed;
            pcVar14 = pcVar13;
          } while (cVar1 != '&');
          pp_Var5 = __ctype_toupper_loc();
          if ((*pp_Var5)[*pcVar13] == (*pp_Var5)[(char)bVar7]) {
            bVar15 = false;
            in_RAX = (ulong)((int)uVar9 + 1);
            goto LAB_0012bcf8;
          }
LAB_0012bbed:
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar8);
      }
      if (iVar11 < 1) {
        bVar15 = true;
      }
      else {
        bVar7 = *__s;
        uVar9 = 0;
        iVar11 = 0;
        do {
          bVar15 = bVar7 == 0;
          if (bVar7 == 0) {
            local_150 = uVar9 & 0xffffffff;
          }
          else {
            pcVar14 = local_168[uVar9];
            bVar12 = bVar7;
            pbVar10 = __s;
            do {
              pbVar10 = pbVar10 + 1;
              if (*pcVar14 == '&') {
                pcVar14 = pcVar14 + 1;
              }
              else if (*pcVar14 == '\0') goto LAB_0012bc9a;
              pp_Var5 = __ctype_toupper_loc();
              if ((*pp_Var5)[(char)bVar12] != (*pp_Var5)[*pcVar14]) goto LAB_0012bc9a;
              pcVar14 = pcVar14 + 1;
              bVar12 = *pbVar10;
              bVar15 = bVar12 == 0;
            } while (!bVar15);
            local_150 = uVar9 & 0xffffffff;
          }
LAB_0012bc9a:
          iVar11 = iVar11 + (uint)bVar15;
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar8);
        bVar15 = iVar11 != 1;
      }
      in_RAX = in_RAX & 0xffffffff;
      if (!bVar15) {
        in_RAX = (ulong)((int)local_150 + 1);
      }
    }
LAB_0012bcf8:
    if (!bVar15) {
      return (int)in_RAX;
    }
  } while( true );
}

Assistant:

int tio_input_dialog(int icon_id, const char *prompt,
                     int standard_button_set,
                     const char **buttons, int button_count,
                     int default_index, int cancel_index)
{
    /* ignore the icon ID - we can't display an icon in text mode */
    VARUSED(icon_id);

    /* keep going until we get a valid response */
    for (;;)
    {
        int i;
        char buf[256];
        const char *p;
        const char *cur;
        char *resp;
        int match_cnt;
        int last_found;
        static const struct
        {
            const char *buttons[3];
            int button_count;
        } std_btns[] =
        {
            { { "&OK" },                    1 },
            { { "&OK", "&Cancel" },         2 },
            { { "&Yes", "&No" },            2 },
            { { "&Yes", "&No", "&Cancel" }, 3 }
        };

        /* 
         *   if we have a standard button set selected, get our button
         *   labels 
         */
        switch(standard_button_set)
        {
        case 0:
            /* use the explicit buttons provided */
            break;

        case OS_INDLG_OK:
            i = 0;

        use_std_btns:
            /* use the selected standard button set */
            buttons = (const char **)std_btns[i].buttons;
            button_count = std_btns[i].button_count;
            break;

        case OS_INDLG_OKCANCEL:
            i = 1;
            goto use_std_btns;

        case OS_INDLG_YESNO:
            i = 2;
            goto use_std_btns;

        case OS_INDLG_YESNOCANCEL:
            i = 3;
            goto use_std_btns;

        default:
            /* 
             *   we don't recognize other standard button sets - return an
             *   error 
             */
            return 0;
        }

        /* 
         *   if there are no buttons defined, they'll never be able to
         *   respond, so we'd just loop forever - rather than let that
         *   happen, return failure 
         */
        if (button_count == 0)
            return 0;

        /* display a newline and the prompt string */
        outformat("\\n");
        outformat((char *)prompt);
        outformat(" ");

        /* display the response */
        for (i = 0 ; i < button_count ; ++i)
        {
            /* 
             *   display a slash to separate responses, if this isn't the
             *   first one 
             */
            if (i != 0)
                outformat("/");

            /* get the current button */
            cur = buttons[i];

            /* 
             *   Look for a "&" in the response string.  If we find it,
             *   remove the "&" and enclose the shortcut key in parens.  
             */
            for (p = cur ; *p != '&' && *p != '\0' ; ++p) ;

            /* if we found the "&", put the next character in parens */
            if (*p == '&')
            {
                /* reformat the response string */
                sprintf(buf, "%.*s(%c)%s", (int)(p - cur), cur, *(p+1), p+2);

                /* display it */
                outformat(buf);
            }
            else
            {
                /* no '&' - just display the response string as-is */
                outformat((char *)cur);
            }
        }

        /* if we're in HTML mode, switch to input font */
        if (tio_is_html_mode())
            outformat("<font face='TADS-Input'>");

        /* read the response */
        getstring(" >", buf, sizeof(buf));

        /* if we're in HTML mode, close the input font tag */
        if (tio_is_html_mode())
            outformat("</font>");

        /* skip any leading spaces in the reply */
        for (resp = buf ; t_isspace(*resp) ; ++resp) ;

        /* if it's one character, check it against the shortcut keys */
        if (strlen(resp) == 1)
        {
            /* scan the responses */
            for (i = 0 ; i < button_count ; ++i)
            {
                /* look for a '&' in this button */
                for (p = buttons[i] ; *p != '&' && *p != '\0' ; ++p) ;

                /* if we found the '&', check the shortcut */
                if (*p == '&' && toupper(*(p+1)) == toupper(*resp))
                {
                    /* 
                     *   this is the one - return the current index
                     *   (bumping it by one to get a 1-based value) 
                     */
                    return i + 1;
                }
            }
        }

        /* 
         *   Either it's not a one-character reply, or it didn't match a
         *   short-cut - check it against the leading substrings of the
         *   responses.  If it matches exactly one of the responses in its
         *   leading substring, use that response.  
         */
        for (i = 0, match_cnt = 0 ; i < button_count ; ++i)
        {
            const char *p1;
            const char *p2;

            /* 
             *   compare this response to the user's response; skip any
             *   '&' in the button label 
             */
            for (p1 = resp, p2 = buttons[i] ; *p1 != '\0' && *p2 != '\0' ;
                 ++p1, ++p2)
            {
                /* if this is a '&' in the button label, skip it */
                if (*p2 == '&')
                    ++p2;

                /* if these characters don't match, it's no match */
                if (toupper(*p1) != toupper(*p2))
                    break;
            }

            /* 
             *   if we reached the end of the user's response, we have a
             *   match in the leading substring - count it and remember
             *   this as the last one, but keep looking, since we need to
             *   make sure we don't have any other matches 
             */
            if (*p1 == '\0')
            {
                ++match_cnt;
                last_found = i;
            }
        }
        
        /* 
         *   if we found exactly one match, return it (adjusting to a
         *   1-based index); if we found more or less than one match, it's
         *   not a valid response, so start over with a new prompt 
         */
        if (match_cnt == 1)
            return last_found + 1;
    }
}